

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void hexdump(char *p,char *ref,size_t l,size_t offset)

{
  uint uVar1;
  char local_39;
  wchar_t c;
  char sep;
  size_t j;
  size_t i;
  size_t offset_local;
  size_t l_local;
  char *ref_local;
  char *p_local;
  
  if (p == (char *)0x0) {
    logprintf("(null)\n");
  }
  else {
    for (j = 0; j < l; j = j + 0x10) {
      logprintf("%04x",(ulong)(uint)((int)j + (int)offset));
      local_39 = ' ';
      for (_c = 0; _c < 0x10 && j + _c < l; _c = _c + 1) {
        if ((ref != (char *)0x0) && (p[j + _c] != ref[j + _c])) {
          local_39 = '_';
        }
        logprintf("%c%02x",(ulong)(uint)(int)local_39,(ulong)(byte)p[j + _c]);
        if ((ref != (char *)0x0) && (p[j + _c] == ref[j + _c])) {
          local_39 = ' ';
        }
      }
      for (; _c < 0x10; _c = _c + 1) {
        logprintf("%c  ",(ulong)(uint)(int)local_39);
        local_39 = ' ';
      }
      logprintf("%c",(ulong)(uint)(int)local_39);
      for (_c = 0; _c < 0x10 && j + _c < l; _c = _c + 1) {
        uVar1 = (uint)p[j + _c];
        if (((int)uVar1 < 0x20) || (0x7e < (int)uVar1)) {
          logprintf(".");
        }
        else {
          logprintf("%c",(ulong)uVar1);
        }
      }
      logprintf("\n");
    }
  }
  return;
}

Assistant:

static void
hexdump(const char *p, const char *ref, size_t l, size_t offset)
{
	size_t i, j;
	char sep;

	if (p == NULL) {
		logprintf("(null)\n");
		return;
	}
	for(i=0; i < l; i+=16) {
		logprintf("%04x", (unsigned)(i + offset));
		sep = ' ';
		for (j = 0; j < 16 && i + j < l; j++) {
			if (ref != NULL && p[i + j] != ref[i + j])
				sep = '_';
			logprintf("%c%02x", sep, 0xff & (unsigned int)p[i+j]);
			if (ref != NULL && p[i + j] == ref[i + j])
				sep = ' ';
		}
		for (; j < 16; j++) {
			logprintf("%c  ", sep);
			sep = ' ';
		}
		logprintf("%c", sep);
		for (j=0; j < 16 && i + j < l; j++) {
			int c = p[i + j];
			if (c >= ' ' && c <= 126)
				logprintf("%c", c);
			else
				logprintf(".");
		}
		logprintf("\n");
	}
}